

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rolemaskproxymodel.cpp
# Opt level: O0

QMap<int,_QVariant> __thiscall
RoleMaskProxyModel::itemData(RoleMaskProxyModel *this,QModelIndex *index)

{
  bool bVar1;
  long lVar2;
  RoleMaskProxyModelPrivate *this_00;
  long *plVar3;
  int *piVar4;
  QVariant *pQVar5;
  RolesContainer *pRVar6;
  QModelIndex *in_RDX;
  bool local_f1;
  const_iterator local_b8;
  const_iterator iEnd;
  const_iterator i_1;
  const_iterator local_a0;
  const_iterator baseEnd;
  const_iterator i;
  QMap<int,_QVariant> baseData;
  int local_7c;
  const_iterator local_78;
  int local_6c;
  const_iterator local_68;
  const_iterator displayIter;
  FlaggedRolesContainer *maskedData;
  undefined1 local_48 [8];
  QModelIndex sourceIdx;
  RolesContainer result;
  RoleMaskProxyModelPrivate *d;
  QModelIndex *index_local;
  RoleMaskProxyModel *this_local;
  
  bVar1 = QModelIndex::isValid(in_RDX);
  if ((bVar1) && (lVar2 = QAbstractProxyModel::sourceModel(), lVar2 != 0)) {
    this_00 = d_func((RoleMaskProxyModel *)index);
    QMap<int,_QVariant>::QMap((QMap<int,_QVariant> *)&sourceIdx.m);
    (**(code **)(*(long *)index + 400))(local_48,index,in_RDX);
    displayIter.i._M_node =
         (const_iterator)RoleMaskProxyModelPrivate::dataForIndex(this_00,(QModelIndex *)local_48);
    if (displayIter.i._M_node != (_Base_ptr)0x0) {
      QMap<int,_QVariant>::operator=
                ((QMap<int,_QVariant> *)&sourceIdx.m,(QMap<int,_QVariant> *)displayIter.i._M_node);
      local_6c = 0;
      local_68._M_node =
           (_Base_ptr)QMap<int,_QVariant>::constFind((QMap<int,_QVariant> *)&sourceIdx.m,&local_6c);
      local_f1 = false;
      if ((this_00->m_mergeDisplayEdit & 1U) != 0) {
        local_78._M_node = (_Base_ptr)QMap<int,_QVariant>::cend((QMap<int,_QVariant> *)&sourceIdx.m)
        ;
        local_f1 = ::operator!=((const_iterator *)&local_68,(const_iterator *)&local_78);
      }
      if (local_f1 != false) {
        local_7c = 2;
        pQVar5 = QMap<int,_QVariant>::const_iterator::value((const_iterator *)&local_68);
        QMap<int,_QVariant>::insert((QMap<int,_QVariant> *)&sourceIdx.m,&local_7c,pQVar5);
      }
    }
    plVar3 = (long *)QAbstractProxyModel::sourceModel();
    (**(code **)(*plVar3 + 0xb0))(&i,plVar3,local_48);
    baseEnd = QMap<int,_QVariant>::cbegin((QMap<int,_QVariant> *)&i);
    local_a0._M_node = (_Base_ptr)QMap<int,_QVariant>::cend((QMap<int,_QVariant> *)&i);
    while (bVar1 = ::operator!=(&baseEnd,(const_iterator *)&local_a0), bVar1) {
      piVar4 = QMap<int,_QVariant>::const_iterator::key(&baseEnd);
      bVar1 = QMap<int,_QVariant>::contains((QMap<int,_QVariant> *)&sourceIdx.m,piVar4);
      if (!bVar1) {
        piVar4 = QMap<int,_QVariant>::const_iterator::key(&baseEnd);
        bVar1 = QSet<int>::contains(&this_00->m_maskedRoles,piVar4);
        if ((!bVar1) || ((this_00->m_transparentIfEmpty & 1U) != 0)) {
          piVar4 = QMap<int,_QVariant>::const_iterator::key(&baseEnd);
          pQVar5 = QMap<int,_QVariant>::const_iterator::value(&baseEnd);
          QMap<int,_QVariant>::insert((QMap<int,_QVariant> *)&sourceIdx.m,piVar4,pQVar5);
        }
      }
      QMap<int,_QVariant>::const_iterator::operator++(&baseEnd);
    }
    if ((this_00->m_transparentIfEmpty & 1U) == 0) {
      iEnd = QMap<int,_QVariant>::cbegin(&this_00->m_defaultValues);
      local_b8._M_node = (_Base_ptr)QMap<int,_QVariant>::cend(&this_00->m_defaultValues);
      while (bVar1 = ::operator!=(&iEnd,(const_iterator *)&local_b8), bVar1) {
        piVar4 = QMap<int,_QVariant>::const_iterator::key(&iEnd);
        bVar1 = QMap<int,_QVariant>::contains((QMap<int,_QVariant> *)&sourceIdx.m,piVar4);
        if (!bVar1) {
          piVar4 = QMap<int,_QVariant>::const_iterator::key(&iEnd);
          pQVar5 = QMap<int,_QVariant>::const_iterator::value(&iEnd);
          QMap<int,_QVariant>::insert((QMap<int,_QVariant> *)&sourceIdx.m,piVar4,pQVar5);
        }
        QMap<int,_QVariant>::const_iterator::operator++(&iEnd);
      }
    }
    pRVar6 = convertFromContainer<QMap<int,QVariant>,void>((RolesContainer *)&sourceIdx.m);
    QMap<int,_QVariant>::QMap((QMap<int,_QVariant> *)this,pRVar6);
    QMap<int,_QVariant>::~QMap((QMap<int,_QVariant> *)&i);
    QMap<int,_QVariant>::~QMap((QMap<int,_QVariant> *)&sourceIdx.m);
  }
  else {
    memset(this,0,8);
    QMap<int,_QVariant>::QMap((QMap<int,_QVariant> *)this);
  }
  return (QMap<int,_QVariant>)
         (QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>_>
          )this;
}

Assistant:

QMap<int, QVariant> RoleMaskProxyModel::itemData(const QModelIndex &index) const
{
    if (!index.isValid() || !sourceModel())
        return QMap<int, QVariant>();
    Q_D(const RoleMaskProxyModel);
    RolesContainer result;
    const QModelIndex sourceIdx = mapToSource(index);
    const FlaggedRolesContainer *maskedData = d->dataForIndex(sourceIdx);
    if (maskedData) {
        result = maskedData->roles;
        const auto displayIter = result.constFind(Qt::DisplayRole);
        if (d->m_mergeDisplayEdit && displayIter != result.cend())
            result.insert(Qt::EditRole, displayIter.value());
    }
    const QMap<int, QVariant> baseData = sourceModel()->itemData(sourceIdx);
    for (auto i = baseData.cbegin(), baseEnd = baseData.cend(); i != baseEnd; ++i) {
        if (!result.contains(i.key()) && (!d->m_maskedRoles.contains(i.key()) || d->m_transparentIfEmpty))
            result.insert(i.key(), i.value());
    }
    if (!d->m_transparentIfEmpty) {
        for (auto i = d->m_defaultValues.cbegin(), iEnd = d->m_defaultValues.cend(); i != iEnd; ++i) {
            if (!result.contains(i.key()))
                result.insert(i.key(), i.value());
        }
    }
    return convertFromContainer<QMap<int, QVariant>>(result);
}